

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFullTypeName(ParserImpl *this,string *name)

{
  string *dest;
  bool bVar1;
  AlphaNum local_e0;
  AlphaNum local_b0;
  uint local_7c;
  undefined1 local_78 [8];
  string part;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *name_local;
  ParserImpl *this_local;
  
  local_20 = name;
  name_local = (string *)this;
  bVar1 = ConsumeIdentifier(this,name);
  if (bVar1) {
    do {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,".",&local_41);
      bVar1 = TryConsume(this,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator(&local_41);
      if (!bVar1) {
        this_local._7_1_ = 1;
        break;
      }
      std::__cxx11::string::string((string *)local_78);
      bVar1 = ConsumeIdentifier(this,(string *)local_78);
      dest = local_20;
      if (bVar1) {
        absl::lts_20250127::AlphaNum::AlphaNum(&local_b0,".");
        absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                  (&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
        absl::lts_20250127::StrAppend(dest,&local_b0,&local_e0);
      }
      else {
        this_local._7_1_ = 0;
      }
      local_7c = (uint)!bVar1;
      std::__cxx11::string::~string((string *)local_78);
    } while (local_7c == 0);
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ConsumeFullTypeName(std::string* name) {
    DO(ConsumeIdentifier(name));
    while (TryConsume(".")) {
      std::string part;
      DO(ConsumeIdentifier(&part));
      absl::StrAppend(name, ".", part);
    }
    return true;
  }